

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O3

int aes_init_dec(aes_context *ctx,uint8_t *key,int bits)

{
  uint uVar1;
  undefined8 uVar2;
  int iVar3;
  aes_context *paVar4;
  long lVar5;
  long lVar6;
  uint32_t *puVar7;
  uint32_t *puVar8;
  aes_context enc;
  aes_context aStack_128;
  
  if (bits == 0x80) {
    iVar3 = 10;
  }
  else {
    if (bits != 0x100) {
      return -1;
    }
    iVar3 = 0xe;
  }
  ctx->nr = iVar3;
  iVar3 = aes_init(&aStack_128,key,bits);
  if (iVar3 < 0) {
    iVar3 = -1;
  }
  else {
    lVar5 = (long)ctx->nr;
    paVar4 = (aes_context *)(aStack_128.key + lVar5 * 4 + -4);
    uVar2 = *(undefined8 *)(aStack_128.key + lVar5 * 4 + 2);
    *(undefined8 *)ctx->key = *(undefined8 *)(aStack_128.key + lVar5 * 4);
    *(undefined8 *)(ctx->key + 2) = uVar2;
    puVar8 = ctx->key + 4;
    lVar6 = lVar5 + -1;
    if ((int)lVar6 == 0) {
      puVar7 = aStack_128.key + lVar5 * 4;
    }
    else {
      do {
        puVar7 = (uint32_t *)paVar4;
        uVar1 = *puVar7;
        *puVar8 = (TD[Te[(ulong)uVar1 & 0xff]] << 8 | TD[Te[(ulong)uVar1 & 0xff]] >> 0x18) ^
                  (TD[Te[uVar1 >> 8 & 0xff]] << 0x10 | TD[Te[uVar1 >> 8 & 0xff]] >> 0x10) ^
                  (TD[Te[uVar1 >> 0x10 & 0xff]] << 0x18 | TD[Te[uVar1 >> 0x10 & 0xff]] >> 8) ^
                  TD[Te[uVar1 >> 0x18]];
        uVar1 = puVar7[1];
        puVar8[1] = (TD[Te[(ulong)uVar1 & 0xff]] << 8 | TD[Te[(ulong)uVar1 & 0xff]] >> 0x18) ^
                    (TD[Te[uVar1 >> 8 & 0xff]] << 0x10 | TD[Te[uVar1 >> 8 & 0xff]] >> 0x10) ^
                    (TD[Te[uVar1 >> 0x10 & 0xff]] << 0x18 | TD[Te[uVar1 >> 0x10 & 0xff]] >> 8) ^
                    TD[Te[uVar1 >> 0x18]];
        uVar1 = puVar7[2];
        puVar8[2] = (TD[Te[(ulong)uVar1 & 0xff]] << 8 | TD[Te[(ulong)uVar1 & 0xff]] >> 0x18) ^
                    (TD[Te[uVar1 >> 8 & 0xff]] << 0x10 | TD[Te[uVar1 >> 8 & 0xff]] >> 0x10) ^
                    (TD[Te[uVar1 >> 0x10 & 0xff]] << 0x18 | TD[Te[uVar1 >> 0x10 & 0xff]] >> 8) ^
                    TD[Te[uVar1 >> 0x18]];
        uVar1 = puVar7[3];
        puVar8[3] = (TD[Te[(ulong)uVar1 & 0xff]] << 8 | TD[Te[(ulong)uVar1 & 0xff]] >> 0x18) ^
                    (TD[Te[uVar1 >> 8 & 0xff]] << 0x10 | TD[Te[uVar1 >> 8 & 0xff]] >> 0x10) ^
                    (TD[Te[uVar1 >> 0x10 & 0xff]] << 0x18 | TD[Te[uVar1 >> 0x10 & 0xff]] >> 8) ^
                    TD[Te[uVar1 >> 0x18]];
        puVar8 = puVar8 + 4;
        paVar4 = (aes_context *)(puVar7 + -4);
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    *puVar8 = paVar4->nr;
    *(undefined8 *)(puVar8 + 1) = *(undefined8 *)(puVar7 + -3);
    puVar8[3] = puVar7[-1];
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int aes_init_dec(aes_context* ctx, const uint8_t* key, int bits)
{
    switch(bits) {
        case 128: ctx->nr = 10; break;
        case 256: ctx->nr = 14; break;
        default: return -1;
    }
#if PLATFORM_SUPPORTS_AESNI
    if (aes_supported_x86())
    {
        aes_init_dec_x86(ctx, key);
        return 0;
    }
#endif

    aes_context enc;
    if (aes_init(&enc, key, bits) < 0)
        return -1;

    uint32_t* ekey = enc.key + 4 * ctx->nr;
    uint32_t* dkey = ctx->key;

    *dkey++ = ekey[0];
    *dkey++ = ekey[1];
    *dkey++ = ekey[2];
    *dkey++ = ekey[3];
    ekey -= 4;

    for (size_t i = ctx->nr - 1; i > 0; i--)
    {
        *dkey++ = setup_mix2(ekey[0]);
        *dkey++ = setup_mix2(ekey[1]);
        *dkey++ = setup_mix2(ekey[2]);
        *dkey++ = setup_mix2(ekey[3]);
        ekey -= 4;
    }

    *dkey++ = ekey[0];
    *dkey++ = ekey[1];
    *dkey++ = ekey[2];
    *dkey++ = ekey[3];
    return 0;
}